

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.cpp
# Opt level: O3

int MeCab::anon_unknown_3::atohex(char *s)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  ostream *poVar4;
  int iVar5;
  byte *pbVar6;
  die local_32;
  die local_31;
  
  sVar3 = strlen(s);
  if (((sVar3 < 3) || (*s != '0')) || ((byte)(s[1] | 0x20U) != 0x78)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"std::strlen(s) >= 3 && s[0] == \'0\' && (s[1] == \'x\' || s[1] == \'X\')",
               0x42);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"no hex value: ",0xe);
    if (s == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar3 = strlen(s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,s,sVar3);
    }
    die::~die(&local_31);
  }
  bVar1 = s[2];
  if (bVar1 == 0) {
    iVar5 = 0;
  }
  else {
    pbVar6 = (byte *)(s + 3);
    iVar5 = 0;
    do {
      if ((byte)(bVar1 - 0x30) < 10) {
        uVar2 = (uint)(byte)(bVar1 - 0x30);
      }
      else if ((byte)(bVar1 + 0xbf) < 6) {
        uVar2 = bVar1 - 0x37;
      }
      else if ((byte)(bVar1 + 0x9f) < 6) {
        uVar2 = bVar1 - 0x57;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x2c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"false",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"no hex value: ",0xe);
        sVar3 = strlen(s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,s,sVar3);
        die::~die(&local_32);
        uVar2 = 0;
      }
      iVar5 = iVar5 * 0x10 + uVar2;
      bVar1 = *pbVar6;
      pbVar6 = pbVar6 + 1;
    } while (bVar1 != 0);
  }
  return iVar5;
}

Assistant:

int atohex(const char *s) {
  int n = 0;

  CHECK_DIE(std::strlen(s) >= 3
            && s[0] == '0' && (s[1] == 'x' || s[1] == 'X'))
      << "no hex value: " << s;

  const char *p = s;
  s += 2;
  while (*s) {
    int r = 0;
    if (*s >= '0' && *s <= '9')
      r = *s - '0';
    else if (*s >= 'A' && *s <= 'F')
      r = *s - 'A' + 10;
    else if (*s >= 'a' && *s <= 'f')
      r = *s - 'a' + 10;
    else
      CHECK_DIE(false) << "no hex value: " << p;

    n = 16 * n + r;
    s++;
  }

  return n;
}